

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::Equals
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this,
          ParamIteratorInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
          *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_00;
  __tuple_element_t<0UL,_tuple<ParamIterator<DescriptorPoolMode>,_ParamIterator<const_char_*>_>_>
  *this_01;
  __tuple_element_t<0UL,_tuple<ParamIterator<DescriptorPoolMode>,_ParamIterator<const_char_*>_>_>
  *other_00;
  __tuple_element_t<1UL,_tuple<ParamIterator<DescriptorPoolMode>,_ParamIterator<const_char_*>_>_>
  *this_02;
  __tuple_element_t<1UL,_tuple<ParamIterator<DescriptorPoolMode>,_ParamIterator<const_char_*>_>_>
  *other_01;
  bool local_89;
  bool dummy [2];
  bool same;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *typed_other;
  GTestLog local_24;
  ParamIteratorInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  *local_20;
  ParamIteratorInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  *other_local;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_local;
  
  local_20 = other;
  other_local = &this->
                 super_ParamIteratorInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  ;
  iVar2 = (*(this->
            super_ParamIteratorInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
            )._vptr_ParamIteratorInterface[2])();
  iVar3 = (*local_20->_vptr_ParamIteratorInterface[2])();
  bVar1 = IsTrue(CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3));
  if (!bVar1) {
    GTestLog::GTestLog(&local_24,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x371);
    poVar4 = GTestLog::GetStream(&local_24);
    poVar4 = std::operator<<(poVar4,"Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    poVar4 = std::operator<<(poVar4,"from different generators.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    GTestLog::~GTestLog(&local_24);
  }
  this_00 = CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<google::protobuf::descriptor_unittest::DescriptorPoolMode,char_const*>::IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul>>const,testing::internal::ParamIteratorInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,char_const*>>const>
                      (local_20);
  bVar1 = AtEnd(this);
  if ((bVar1) && (bVar1 = AtEnd(this_00), bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    this_01 = std::
              get<0ul,testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,testing::internal::ParamIterator<char_const*>>
                        (&this->current_);
    other_00 = std::
               get<0ul,testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,testing::internal::ParamIterator<char_const*>>
                         (&this_00->current_);
    bVar1 = ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>::operator==
                      (this_01,other_00);
    local_89 = false;
    if (bVar1) {
      this_02 = std::
                get<1ul,testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,testing::internal::ParamIterator<char_const*>>
                          (&this->current_);
      other_01 = std::
                 get<1ul,testing::internal::ParamIterator<google::protobuf::descriptor_unittest::DescriptorPoolMode>,testing::internal::ParamIterator<char_const*>>
                           (&this_00->current_);
      local_89 = ParamIterator<const_char_*>::operator==(this_02,other_01);
    }
    this_local._7_1_ = local_89;
  }
  return this_local._7_1_;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }